

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void continuous_dist_test_integrate_pdf<trng::beta_dist<long_double>>(beta_dist<long_double> *d)

{
  StringRef capturedExpression;
  __normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_> last;
  undefined1 x [16];
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  longlong *plVar1;
  int iVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar5;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  double __x;
  double __x_00;
  AssertionHandler catchAssertionHandler;
  result_type tol;
  result_type s;
  int i;
  vector<long_double,_std::allocator<long_double>_> y;
  result_type dx;
  result_type x_max;
  result_type x_min;
  int samples;
  undefined4 uVar6;
  Flags resultDisposition;
  undefined4 uVar7;
  undefined2 uVar8;
  undefined6 in_stack_fffffffffffffe12;
  StringRef *in_stack_fffffffffffffe18;
  AssertionHandler *this;
  undefined1 *puVar9;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 uVar10;
  undefined6 uVar11;
  undefined2 in_stack_fffffffffffffe3e;
  undefined4 in_stack_fffffffffffffe60;
  __normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_>
  in_stack_fffffffffffffe68;
  undefined2 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe72 [14];
  beta_dist<long_double> *in_stack_fffffffffffffe88;
  AssertionHandler local_130;
  longdouble local_c8;
  longdouble *local_b8;
  longdouble *local_b0;
  longdouble local_a8;
  int local_74;
  undefined1 local_70 [24];
  longdouble local_58;
  longdouble local_38;
  long local_20;
  longlong local_18;
  int local_c;
  
  local_18 = 0x100000;
  std::numeric_limits<long_double>::epsilon();
  __x_00 = std::sqrt(__x);
  lVar4 = in_ST7;
  lVar5 = in_ST7;
  std::round(__x_00);
  local_20 = (long)ROUND(in_ST2);
  plVar1 = std::min<long_long>(&local_18,&local_20);
  local_c = (int)*plVar1;
  x._2_14_ = in_stack_fffffffffffffe72;
  x._0_2_ = in_stack_fffffffffffffe70;
  trng::beta_dist<long_double>::icdf(in_stack_fffffffffffffe88,(result_type_conflict3)x);
  uVar6 = (undefined4)_DAT_00468380;
  resultDisposition = (Flags)((unkuint10)_DAT_00468380 >> 0x20);
  uVar8 = (undefined2)((unkuint10)_DAT_00468380 >> 0x40);
  x_00._2_14_ = in_stack_fffffffffffffe72;
  x_00._0_2_ = in_stack_fffffffffffffe70;
  local_38 = in_ST3;
  trng::beta_dist<long_double>::icdf(in_stack_fffffffffffffe88,(result_type_conflict3)x_00);
  local_58 = (in_ST4 - local_38) / (longdouble)local_c;
  iVar2 = local_c;
  std::vector<long_double,_std::allocator<long_double>_>::vector
            ((vector<long_double,_std::allocator<long_double>_> *)0x3792f5);
  for (local_74 = 0; local_74 <= local_c; local_74 = local_74 + 1) {
    lVar3 = local_58 * (longdouble)local_74 + local_38;
    uVar6 = SUB104(lVar3,0);
    resultDisposition = (Flags)((unkuint10)lVar3 >> 0x20);
    uVar8 = (undefined2)((unkuint10)lVar3 >> 0x40);
    x_01._2_14_ = in_stack_fffffffffffffe72;
    x_01._0_2_ = in_stack_fffffffffffffe70;
    in_ST5 = in_ST6;
    in_ST6 = in_ST7;
    in_ST7 = lVar4;
    lVar4 = lVar5;
    trng::beta_dist<long_double>::pdf(in_stack_fffffffffffffe88,(result_type_conflict3)x_01);
    std::vector<long_double,_std::allocator<long_double>_>::push_back
              ((vector<long_double,_std::allocator<long_double>_> *)
               CONCAT62(in_stack_fffffffffffffe12,uVar8),
               (value_type_conflict7 *)CONCAT44(resultDisposition,uVar6));
  }
  puVar9 = local_70;
  local_b0 = (longdouble *)
             std::vector<long_double,_std::allocator<long_double>_>::begin
                       ((vector<long_double,_std::allocator<long_double>_> *)
                        CONCAT44(resultDisposition,uVar6));
  local_b8 = (longdouble *)
             std::vector<long_double,_std::allocator<long_double>_>::end
                       ((vector<long_double,_std::allocator<long_double>_> *)
                        CONCAT44(resultDisposition,uVar6));
  last._M_current._4_4_ = iVar2;
  last._M_current._0_4_ = in_stack_fffffffffffffe60;
  simpson_int<__gnu_cxx::__normal_iterator<long_double*,std::vector<long_double,std::allocator<long_double>>>>
            (in_stack_fffffffffffffe68,last);
  uVar10 = SUB104(in_ST5,0);
  uVar11 = (undefined6)((unkuint10)in_ST5 >> 0x20);
  local_a8 = local_58 * in_ST5;
  local_c8 = ((longdouble)64.0 / (longdouble)local_c) / (longdouble)local_c;
  local_130.m_assertionInfo.lineInfo =
       (SourceLineInfo)
       operator____catch_sr
                 ((char *)CONCAT62(in_stack_fffffffffffffe12,uVar8),
                  CONCAT44(resultDisposition,uVar6));
  this = &local_130;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0x94);
  Catch::StringRef::StringRef((StringRef *)this,(char *)in_stack_fffffffffffffe18);
  iVar2 = (int)&local_130 + 0x20;
  capturedExpression.m_size._0_4_ = in_stack_fffffffffffffe30;
  capturedExpression.m_start = puVar9;
  capturedExpression.m_size._4_4_ = uVar10;
  Catch::AssertionHandler::AssertionHandler
            (this,in_stack_fffffffffffffe18,
             (SourceLineInfo *)CONCAT62(in_stack_fffffffffffffe12,uVar8),capturedExpression,
             resultDisposition);
  lVar4 = _DAT_00468390 + local_a8;
  uVar6 = SUB104(lVar4,0);
  uVar7 = (undefined4)((unkuint10)lVar4 >> 0x20);
  uVar8 = (undefined2)((unkuint10)lVar4 >> 0x40);
  std::abs(iVar2);
  Catch::Decomposer::operator<=((Decomposer *)CONCAT44(uVar7,uVar6),(longdouble *)0x3794cc);
  Catch::ExprLhs<long_double_const&>::operator<
            ((ExprLhs<const_long_double_&> *)CONCAT26(in_stack_fffffffffffffe3e,uVar11),
             (longdouble *)CONCAT44(uVar10,in_stack_fffffffffffffe30));
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)CONCAT62(in_stack_fffffffffffffe12,uVar8),
             (ITransientExpression *)CONCAT44(uVar7,uVar6));
  Catch::BinaryExpr<const_long_double_&,_const_long_double_&>::~BinaryExpr
            ((BinaryExpr<const_long_double_&,_const_long_double_&> *)0x379523);
  Catch::AssertionHandler::complete((AssertionHandler *)CONCAT62(in_stack_fffffffffffffe12,uVar8));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)CONCAT62(in_stack_fffffffffffffe12,uVar8));
  std::vector<long_double,_std::allocator<long_double>_>::~vector
            ((vector<long_double,_std::allocator<long_double>_> *)this);
  return;
}

Assistant:

void continuous_dist_test_integrate_pdf(const dist &d) {
  using result_type = typename dist::result_type;
  const int samples(static_cast<int>(std::min(
      1024ll * 1024, static_cast<long long>(std::round(
                         1 / std::sqrt(std::numeric_limits<result_type>::epsilon()))))));
  const result_type x_min{d.icdf(result_type(1) / result_type(100))};
  const result_type x_max{d.icdf(result_type(99) / result_type(100))};
  const result_type dx{(x_max - x_min) / samples};
  std::vector<result_type> y;
  for (int i{0}; i <= samples; ++i)
    y.push_back(d.pdf(x_min + i * dx));
  const result_type s{simpson_int(y.begin(), y.end()) * dx};
  const result_type tol{result_type(64) / result_type(samples) / result_type(samples)};
  REQUIRE(std::abs(s - result_type(98) / result_type(100)) < tol);
}